

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshifter.cpp
# Opt level: O0

void anon_unknown.dwarf_1421bc::Fshifter_getParamf(EffectProps *props,ALenum param,float *val)

{
  effect_exception *this;
  undefined4 *in_RDX;
  uint in_ESI;
  undefined4 *in_RDI;
  
  if (in_ESI == 1) {
    *in_RDX = *in_RDI;
    return;
  }
  this = (effect_exception *)__cxa_allocate_exception(0x30);
  effect_exception::effect_exception
            (this,0xa002,"Invalid frequency shifter float property 0x%04x",(ulong)in_ESI);
  __cxa_throw(this,&effect_exception::typeinfo,effect_exception::~effect_exception);
}

Assistant:

void Fshifter_getParamf(const EffectProps *props, ALenum param, float *val)
{
    switch(param)
    {
    case AL_FREQUENCY_SHIFTER_FREQUENCY:
        *val = props->Fshifter.Frequency;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid frequency shifter float property 0x%04x",
            param};
    }
}